

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestEnd
          (PrettyUnitTestResultPrinter *this,TestInfo *test_info)

{
  GTestColor color;
  bool bVar1;
  char *fmt;
  long in_FS_OFFSET;
  TimeInMillis local_40;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = TestResult::Passed(&test_info->result_);
  if (bVar1) {
    fmt = "[       OK ] ";
    color = COLOR_GREEN;
  }
  else {
    fmt = "[  FAILED  ] ";
    color = COLOR_RED;
  }
  ColoredPrintf(color,fmt);
  PrintTestName((test_info->test_case_name_)._M_dataplus._M_p,(test_info->name_)._M_dataplus._M_p);
  bVar1 = TestResult::Failed(&test_info->result_);
  if (bVar1) {
    PrintFullTestCommentIfPresent(test_info);
  }
  if (FLAGS_gtest_print_time == '\x01') {
    local_40 = (test_info->result_).elapsed_time_;
    StreamableToString<long_long>(&local_38,&local_40);
    printf(" (%s ms)\n",local_38._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    putchar(10);
  }
  fflush(_stdout);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestEnd(const TestInfo& test_info) {
  if (test_info.result()->Passed()) {
    ColoredPrintf(COLOR_GREEN, "[       OK ] ");
  } else {
    ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
  }
  PrintTestName(test_info.test_case_name(), test_info.name());
  if (test_info.result()->Failed())
    PrintFullTestCommentIfPresent(test_info);

  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms)\n", internal::StreamableToString(
           test_info.result()->elapsed_time()).c_str());
  } else {
    printf("\n");
  }
  fflush(stdout);
}